

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

void __thiscall FIX::ScreenLog::ScreenLog(ScreenLog *this,bool incoming,bool outgoing,bool event)

{
  allocator<char> local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  bool event_local;
  bool outgoing_local;
  ScreenLog *pSStack_10;
  bool incoming_local;
  ScreenLog *this_local;
  
  local_13 = event;
  local_12 = outgoing;
  local_11 = incoming;
  pSStack_10 = this;
  Log::Log(&this->super_Log);
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__ScreenLog_0030c308;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_prefix,"GLOBAL",&local_14);
  std::allocator<char>::~allocator(&local_14);
  UtcTimeStamp::UtcTimeStamp(&this->m_time);
  this->m_incoming = (bool)(local_11 & 1);
  this->m_outgoing = (bool)(local_12 & 1);
  this->m_event = (bool)(local_13 & 1);
  return;
}

Assistant:

ScreenLog( bool incoming, bool outgoing, bool event )
: m_prefix( "GLOBAL" ),
  m_incoming( incoming ), m_outgoing( outgoing ), m_event( event ) {}